

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_l3_ur.c
# Opt level: O3

int picnic_l3_ur_read_public_key(picnic_l3_ur_publickey_t *key,uint8_t *buf,size_t buflen)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  picnic_instance_t *ppVar8;
  int iVar9;
  
  iVar9 = -1;
  if ((buflen != 0 && (buf != (uint8_t *)0x0 && key != (picnic_l3_ur_publickey_t *)0x0)) &&
     (*buf == '\x04')) {
    ppVar8 = picnic_instance_get(Picnic_L3_UR);
    if ((0x30 < buflen) && (ppVar8 != (picnic_instance_t *)0x0)) {
      uVar1 = *(undefined8 *)(buf + 1);
      uVar2 = *(undefined8 *)(buf + 9);
      uVar3 = *(undefined8 *)(buf + 0x11);
      uVar4 = *(undefined8 *)(buf + 0x19);
      uVar5 = *(undefined8 *)(buf + 0x19);
      uVar6 = *(undefined8 *)(buf + 0x21);
      uVar7 = *(undefined8 *)(buf + 0x29);
      iVar9 = 0;
      *(undefined8 *)(key->data + 0x10) = *(undefined8 *)(buf + 0x11);
      *(undefined8 *)(key->data + 0x18) = uVar5;
      *(undefined8 *)(key->data + 0x20) = uVar6;
      *(undefined8 *)(key->data + 0x28) = uVar7;
      *(undefined8 *)key->data = uVar1;
      *(undefined8 *)(key->data + 8) = uVar2;
      *(undefined8 *)(key->data + 0x10) = uVar3;
      *(undefined8 *)(key->data + 0x18) = uVar4;
    }
  }
  return iVar9;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_l3_ur_read_public_key(picnic_l3_ur_publickey_t* key,
                                                           const uint8_t* buf, size_t buflen) {
  if (!key || !buf || buflen < 1) {
    return -1;
  }

  const picnic_params_t param = buf[0];
  if (param != PARAM) {
    return -1;
  }
  const picnic_instance_t* instance = picnic_instance_get(PARAM);
  if (!instance) {
    return -1;
  }

  if (buflen < PUBLIC_KEY_SIZE) {
    return -1;
  }

#if (LOWMC_BLOCK_BITS & 0x7) != 0
  static const unsigned int diff = LOWMC_BLOCK_SZ * 8 - LOWMC_BLOCK_BITS;
  if (check_padding_bits(buf[1 + LOWMC_BLOCK_SZ - 1], diff) ||
      check_padding_bits(buf[1 + 2 * LOWMC_BLOCK_SZ - 1], diff)) {
    return -1;
  }
#endif

  memcpy(key->data, buf + 1, PUBLIC_KEY_SIZE - 1);
  return 0;
}